

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O1

uint get_max_prime(uint number)

{
  uint uVar1;
  uint uVar2;
  uint in_ESI;
  uint uVar3;
  uint i;
  uint uVar4;
  bool bVar5;
  
  uVar1 = 2;
  if (1 < number) {
    do {
      bVar5 = true;
      uVar3 = in_ESI;
      if ((2 < number) && (bVar5 = (number & 1) == 0, !bVar5)) {
        uVar4 = 3;
        do {
          uVar3 = number;
          if (number == uVar4) break;
          uVar2 = number % uVar4;
          uVar4 = uVar4 + 1;
          bVar5 = uVar2 == 0;
          uVar3 = in_ESI;
        } while (!bVar5);
      }
      uVar1 = uVar3;
    } while ((bVar5) && (bVar5 = 2 < number, number = number - 1, uVar1 = 2, in_ESI = uVar3, bVar5))
    ;
  }
  return uVar1;
}

Assistant:

uint get_max_prime(unsigned int number) {
    for (unsigned int i = number; i >= 2; --i) {
        for (int j = 2; j < i; ++j) {
            if (i % j == 0)
                break;
            if (j == i - 1)
                return i;
        }
    }
    return 2;
}